

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

void __thiscall
cfd::Psbt::CollectInputUtxo(Psbt *this,vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxos)

{
  pointer pUVar1;
  bool bVar2;
  pointer utxo;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  Script redeem_script;
  TxOut txout;
  AbstractTxOutReference local_80;
  
  cfd::core::OutPoint::OutPoint(&outpoint);
  cfd::core::TxOut::TxOut(&txout);
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&redeem_script);
  pUVar1 = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (utxo = (utxos->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
              super__Vector_impl_data._M_start; utxo != pUVar1; utxo = utxo + 1) {
    if ((utxo->descriptor)._M_string_length != 0) {
      std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::clear(&key_list);
      bVar2 = ConvertFromUtxoData(utxo,&outpoint,&txout,&key_list,&redeem_script,true,(NetType *)0x0
                                 );
      if (bVar2) {
        cfd::core::TxOutReference::TxOutReference((TxOutReference *)&local_80,&txout);
        SetTxInUtxo(this,&outpoint,(TxOutReference *)&local_80,&redeem_script,&key_list);
        core::AbstractTxOutReference::~AbstractTxOutReference(&local_80);
      }
    }
  }
  core::Script::~Script(&redeem_script);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
  core::AbstractTxOut::~AbstractTxOut(&txout.super_AbstractTxOut);
  core::Txid::~Txid(&outpoint.txid_);
  return;
}

Assistant:

void Psbt::CollectInputUtxo(const std::vector<UtxoData>& utxos) {
  OutPoint outpoint;
  TxOut txout;
  std::vector<KeyData> key_list;
  Script redeem_script;
  for (const auto& utxo : utxos) {
    if (utxo.descriptor.empty()) continue;
    key_list.clear();
    bool is_witness = ConvertFromUtxoData(
        utxo, &outpoint, &txout, &key_list, &redeem_script, true);
    if (is_witness) {
      SetTxInUtxo(outpoint, TxOutReference(txout), redeem_script, key_list);
    }
  }
}